

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O2

Range<int,_3> * __thiscall
Nova::Grid<float,_3>::Node_Indices
          (Range<int,_3> *__return_storage_ptr__,Grid<float,_3> *this,int number_of_ghost_cells)

{
  float local_58 [2];
  float local_50;
  Vector<int,_3,_true> local_4c;
  Range<int,_3> local_40;
  
  Vector<int,_3,_true>::Vector(&local_4c,1);
  Number_Of_Nodes((Grid<float,_3> *)local_58);
  local_40.min_corner._data._M_elems[2] = local_4c._data._M_elems[2];
  local_40.min_corner._data._M_elems[0] = local_4c._data._M_elems[0];
  local_40.min_corner._data._M_elems[1] = local_4c._data._M_elems[1];
  local_40.max_corner._data._M_elems[0] = (int)local_58[0];
  local_40.max_corner._data._M_elems[1] = (int)local_58[1];
  local_40.max_corner._data._M_elems[2] = (int)local_50;
  Range<int,_3>::Thickened(__return_storage_ptr__,&local_40,number_of_ghost_cells);
  return __return_storage_ptr__;
}

Assistant:

Range<int,d> Node_Indices(const int number_of_ghost_cells=0) const
    {return Range<int,d>(T_INDEX(1),Number_Of_Nodes()).Thickened(number_of_ghost_cells);}